

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall sglr::rc::Texture1D::Texture1D(Texture1D *this,deUint32 name)

{
  (this->super_Texture).super_NamedObject.m_name = name;
  *(undefined8 *)&(this->super_Texture).super_NamedObject.m_refCount = 1;
  (this->super_Texture).m_immutable = false;
  (this->super_Texture).m_sampler.wrapS = REPEAT_GL;
  (this->super_Texture).m_sampler.wrapT = REPEAT_GL;
  (this->super_Texture).m_sampler.wrapR = REPEAT_GL;
  (this->super_Texture).m_sampler.minFilter = NEAREST_MIPMAP_LINEAR;
  (this->super_Texture).m_sampler.magFilter = LINEAR;
  (this->super_Texture).m_sampler.lodThreshold = 0.0;
  (this->super_Texture).m_sampler.normalizedCoords = true;
  (this->super_Texture).m_sampler.compare = COMPAREMODE_NONE;
  (this->super_Texture).m_sampler.compareChannel = 0;
  *(undefined8 *)&(this->super_Texture).m_sampler.borderColor.v = 0;
  *(undefined8 *)((long)&(this->super_Texture).m_sampler.borderColor.v + 8) = 0;
  (this->super_Texture).m_sampler.seamlessCubeMap = true;
  *(undefined8 *)&(this->super_Texture).m_sampler.depthStencilMode = 0;
  (this->super_Texture).m_maxLevel = 1000;
  (this->super_Texture).super_NamedObject._vptr_NamedObject = (_func_int **)&PTR__Texture1D_00b4f8f0
  ;
  TextureLevelArray::TextureLevelArray(&this->m_levels);
  (this->m_view).m_numLevels = 0;
  (this->m_view).m_levels = (ConstPixelBufferAccess *)0x0;
  return;
}

Assistant:

Texture1D::Texture1D (deUint32 name)
	: Texture	(name, TYPE_1D)
	, m_view	(0, DE_NULL)
{
}